

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QPodArrayOps<float>::emplace<float&>(QPodArrayOps<float> *this,qsizetype i,float *args)

{
  float fVar1;
  Data *pDVar2;
  long lVar3;
  float *pfVar4;
  GrowthPosition where;
  
  pDVar2 = (this->super_QArrayDataPointer<float>).d;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_001532c5:
    fVar1 = *args;
    where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<float>).size != 0);
    QArrayDataPointer<float>::detachAndGrow
              (&this->super_QArrayDataPointer<float>,where,1,(float **)0x0,
               (QArrayDataPointer<float> *)0x0);
    pfVar4 = createHole(this,where,i,1);
    *pfVar4 = fVar1;
  }
  else {
    lVar3 = (this->super_QArrayDataPointer<float>).size;
    if ((lVar3 == i && pDVar2 != (Data *)0x0) &&
       ((pDVar2->super_QArrayData).alloc !=
        ((long)((long)(this->super_QArrayDataPointer<float>).ptr -
               ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 2) +
        lVar3)) {
      (this->super_QArrayDataPointer<float>).ptr[lVar3] = *args;
    }
    else {
      if (((i != 0) || (pDVar2 == (Data *)0x0)) ||
         ((float *)((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QArrayDataPointer<float>).ptr)) goto LAB_001532c5;
      pfVar4 = (this->super_QArrayDataPointer<float>).ptr;
      pfVar4[-1] = *args;
      (this->super_QArrayDataPointer<float>).ptr = pfVar4 + -1;
    }
    (this->super_QArrayDataPointer<float>).size = lVar3 + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }